

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGenerator::CheckCMP0037(cmGlobalGenerator *this,string *targetName,string *reason)

{
  cmake *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  cmTarget *this_01;
  ostream *poVar3;
  cmListFileBacktrace *backtrace;
  PolicyID id;
  bool bVar4;
  MessageType t;
  string local_1c8;
  ostringstream e;
  
  this_01 = FindTarget(this,targetName,false);
  if (this_01 == (cmTarget *)0x0) {
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  PVar2 = cmTarget::GetPolicyStatusCMP0037(this_01);
  if (PVar2 - NEW < 3) {
    t = FATAL_ERROR;
    bVar1 = true;
    bVar4 = false;
LAB_0017d10f:
    poVar3 = std::operator<<((ostream *)&e,"The target name \"");
    poVar3 = std::operator<<(poVar3,(string *)targetName);
    poVar3 = std::operator<<(poVar3,"\" is reserved ");
    poVar3 = std::operator<<(poVar3,(string *)reason);
    std::operator<<(poVar3,".");
    if (bVar4) {
      std::operator<<((ostream *)&e,"  It may result in undefined behavior.");
    }
    this_00 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    backtrace = cmTarget::GetBacktrace(this_01);
    cmake::IssueMessage(this_00,t,&local_1c8,backtrace);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (bVar1) {
      bVar4 = false;
      goto LAB_0017d1ae;
    }
  }
  else if (PVar2 == WARN) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x25,id);
    poVar3 = std::operator<<((ostream *)&e,(string *)&local_1c8);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    bVar1 = false;
    bVar4 = true;
    t = AUTHOR_WARNING;
    goto LAB_0017d10f;
  }
  bVar4 = true;
LAB_0017d1ae:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return bVar4;
}

Assistant:

bool cmGlobalGenerator::CheckCMP0037(std::string const& targetName,
                                     std::string const& reason) const
{
  cmTarget* tgt = this->FindTarget(targetName);
  if (!tgt) {
    return true;
  }
  MessageType messageType = MessageType::AUTHOR_WARNING;
  std::ostringstream e;
  bool issueMessage = false;
  switch (tgt->GetPolicyStatusCMP0037()) {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
      issueMessage = true;
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      issueMessage = true;
      messageType = MessageType::FATAL_ERROR;
      break;
  }
  if (issueMessage) {
    e << "The target name \"" << targetName << "\" is reserved " << reason
      << ".";
    if (messageType == MessageType::AUTHOR_WARNING) {
      e << "  It may result in undefined behavior.";
    }
    this->GetCMakeInstance()->IssueMessage(messageType, e.str(),
                                           tgt->GetBacktrace());
    if (messageType == MessageType::FATAL_ERROR) {
      return false;
    }
  }
  return true;
}